

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<kj::ArrayPtr<const_capnp::word>_>::~Array(Array<kj::ArrayPtr<const_capnp::word>_> *this)

{
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }